

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

string * __thiscall rcg::Stream::getTLType_abi_cxx11_(string *__return_storage_ptr__,Stream *this)

{
  recursive_mutex *__mutex;
  char *pcVar1;
  pointer pcVar2;
  int iVar3;
  GC_ERROR GVar4;
  undefined8 uVar5;
  pointer unaff_R13;
  INFO_DATATYPE type;
  size_t size;
  char tmp [1024];
  int local_434;
  size_t local_430;
  char local_428 [1024];
  
  __mutex = &this->mtx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    memset(local_428,0,0x400);
    local_430 = 0x400;
    if (this->stream != (DS_HANDLE)0x0) {
      GVar4 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetInfo)(this->stream,10,&local_434,local_428,&local_430);
      if ((GVar4 == 0) && (local_434 == 1)) {
        pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
        strlen(local_428);
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)local_428);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar5 = std::__throw_system_error(iVar3);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (pcVar2 != unaff_R13) {
    operator_delete(pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar5);
}

Assistant:

std::string Stream::getTLType()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t size=sizeof(tmp);

  if (stream != 0)
  {
    if (gentl->DSGetInfo(stream, GenTL::STREAM_INFO_TLTYPE, &type, tmp, &size) ==
        GenTL::GC_ERR_SUCCESS)
    {
      if (type == GenTL::INFO_DATATYPE_STRING)
      {
        ret=tmp;
      }
    }
  }

  return ret;
}